

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O3

void phosg::parallel_range_blocks_thread_fn<unsigned_long>
               (function<bool_(unsigned_long,_unsigned_long)> *fn,
               atomic<unsigned_long> *current_value,atomic<unsigned_long> *result_value,
               unsigned_long end_value,unsigned_long block_size,size_t thread_num)

{
  bool bVar1;
  unsigned_long uVar2;
  ulong uVar3;
  size_t local_40;
  __atomic_base<unsigned_long> local_38;
  
  LOCK();
  uVar3 = (current_value->super___atomic_base<unsigned_long>)._M_i;
  (current_value->super___atomic_base<unsigned_long>)._M_i =
       (current_value->super___atomic_base<unsigned_long>)._M_i + block_size;
  UNLOCK();
  if (uVar3 < end_value) {
    do {
      uVar2 = block_size;
      if (uVar3 < uVar3 + block_size) {
        do {
          local_40 = thread_num;
          local_38._M_i = uVar3;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
            ::std::__throw_bad_function_call();
          }
          bVar1 = (*fn->_M_invoker)((_Any_data *)fn,&local_38._M_i,&local_40);
          if (bVar1) {
            LOCK();
            (result_value->super___atomic_base<unsigned_long>)._M_i = uVar3;
            UNLOCK();
            LOCK();
            (current_value->super___atomic_base<unsigned_long>)._M_i = end_value;
            UNLOCK();
            break;
          }
          uVar3 = uVar3 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      LOCK();
      uVar3 = (current_value->super___atomic_base<unsigned_long>)._M_i;
      (current_value->super___atomic_base<unsigned_long>)._M_i =
           (current_value->super___atomic_base<unsigned_long>)._M_i + block_size;
      UNLOCK();
    } while (uVar3 < end_value);
  }
  return;
}

Assistant:

void parallel_range_blocks_thread_fn(
    std::function<bool(IntT, size_t thread_num)>& fn,
    std::atomic<IntT>& current_value,
    std::atomic<IntT>& result_value,
    IntT end_value,
    IntT block_size,
    size_t thread_num) {
  IntT block_start;
  while ((block_start = current_value.fetch_add(block_size)) < end_value) {
    IntT block_end = block_start + block_size;
    for (IntT z = block_start; z < block_end; z++) {
      if (fn(z, thread_num)) {
        result_value = z;
        current_value = end_value;
        break;
      }
    }
  }
}